

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathNodeSetDel(xmlNodeSetPtr cur,xmlNodePtr val)

{
  xmlNodePtr ns;
  xmlNodePtr *ppxVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (val != (xmlNodePtr)0x0 && cur != (xmlNodeSetPtr)0x0) {
    uVar2 = cur->nodeNr;
    uVar4 = 0;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      if (cur->nodeTab[uVar4] == val) {
        ns = cur->nodeTab[uVar4];
        if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
          xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
          uVar2 = cur->nodeNr;
        }
        uVar2 = uVar2 - 1;
        cur->nodeNr = uVar2;
        uVar3 = (ulong)uVar2;
        if ((int)uVar2 < (int)uVar4) {
          uVar3 = uVar4 & 0xffffffff;
        }
        for (; ppxVar1 = cur->nodeTab, uVar3 != uVar4; uVar4 = uVar4 + 1) {
          ppxVar1[uVar4] = ppxVar1[uVar4 + 1];
        }
        ppxVar1[(int)uVar2] = (xmlNodePtr)0x0;
        return;
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathNodeSetDel(xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if (cur == NULL) return;
    if (val == NULL) return;

    /*
     * find node in nodeTab
     */
    for (i = 0;i < cur->nodeNr;i++)
        if (cur->nodeTab[i] == val) break;

    if (i >= cur->nodeNr) {	/* not found */
#ifdef DEBUG
        xmlGenericError(xmlGenericErrorContext,
	        "xmlXPathNodeSetDel: Node %s wasn't found in NodeList\n",
		val->name);
#endif
        return;
    }
    if ((cur->nodeTab[i] != NULL) &&
	(cur->nodeTab[i]->type == XML_NAMESPACE_DECL))
	xmlXPathNodeSetFreeNs((xmlNsPtr) cur->nodeTab[i]);
    cur->nodeNr--;
    for (;i < cur->nodeNr;i++)
        cur->nodeTab[i] = cur->nodeTab[i + 1];
    cur->nodeTab[cur->nodeNr] = NULL;
}